

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

void __thiscall FileWriter::logTime(FileWriter *this,Timer *t)

{
  ostream *poVar1;
  long in_RSI;
  rep_conflict rVar2;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  int local_14;
  
  if (in_RSI == 0) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    local_14 = (int)std::setprecision(3);
    poVar1 = std::operator<<(poVar1,(_Setprecision)local_14);
    poVar1 = std::operator<<(poVar1," (took ");
    local_20 = Timer::elapsed((Timer *)poVar1);
    rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_20);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
    poVar1 = std::operator<<(poVar1,"s)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void FileWriter::logTime(const Timer* t) {
  if (t) {
    std::cout
      << std::fixed
      << std::setprecision(3)
      << " (took "
      << t->elapsed().count()
      << "s)"
      << std::endl;
  } else {
    std::cout << std::endl;
  }
}